

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O0

void host_server(ENetHost *server)

{
  unsigned_long_long uVar1;
  int iVar2;
  undefined1 local_30 [8];
  ENetEvent event;
  ENetHost *server_local;
  
  event.packet = (ENetPacket *)server;
  while (iVar2 = enet_host_service((ENetHost *)event.packet,(ENetEvent *)local_30,2), 0 < iVar2) {
    switch(local_30._0_4_) {
    case 0:
      break;
    case 1:
      printf("A new peer with ID %u connected from ::1:%u.\n",(ulong)*(ushort *)(event._0_8_ + 0x1a)
             ,(ulong)*(ushort *)(event._0_8_ + 0x34));
      uVar1 = g_counter + 1;
      *(unsigned_long_long *)(event._0_8_ + 0x38) = g_counter;
      g_counter = uVar1;
      break;
    case 2:
      printf("Peer with ID %u disconnected.\n",(ulong)*(ushort *)(event._0_8_ + 0x1a));
      g_disconnected = g_disconnected + 1;
      *(undefined8 *)(event._0_8_ + 0x38) = 0;
      break;
    case 3:
      printf("A packet of length %zu containing %s was received from %s on channel %u.\n",
             *(undefined8 *)(event._16_8_ + 0x18),*(undefined8 *)(event._16_8_ + 0x10),
             *(undefined8 *)(event._0_8_ + 0x38),(ulong)(byte)event.peer);
      enet_packet_destroy((ENetPacket *)event._16_8_);
      break;
    case 4:
      printf("Client %u timeout.\n",(ulong)*(ushort *)(event._0_8_ + 0x1a));
      g_disconnected = g_disconnected + 1;
      *(undefined8 *)(event._0_8_ + 0x38) = 0;
    }
  }
  return;
}

Assistant:

void host_server(ENetHost *server) {
    ENetEvent event;
    while (enet_host_service(server, &event, 2) > 0) {
        switch (event.type) {
            case ENET_EVENT_TYPE_CONNECT:
                printf("A new peer with ID %u connected from ::1:%u.\n", event.peer->incomingPeerID , event.peer->address.port);
                /* Store any relevant client information here. */
                event.peer->data = (void*)(g_counter++);
                break;
            case ENET_EVENT_TYPE_RECEIVE:
                printf("A packet of length %zu containing %s was received from %s on channel %u.\n",
                        event.packet->dataLength,
                        event.packet->data,
                        (char *)event.peer->data,
                        event.channelID);

                /* Clean up the packet now that we're done using it. */
                enet_packet_destroy (event.packet);
                break;

            case ENET_EVENT_TYPE_DISCONNECT:
                printf ("Peer with ID %u disconnected.\n", event.peer->incomingPeerID);
                g_disconnected++;
                /* Reset the peer's client information. */
                event.peer->data = NULL;
                break;

            case ENET_EVENT_TYPE_DISCONNECT_TIMEOUT:
                printf ("Client %u timeout.\n", event.peer->incomingPeerID);
                g_disconnected++;
                /* Reset the peer's client information. */
                event.peer->data = NULL;
                break;

            case ENET_EVENT_TYPE_NONE: break;
        }
    }
}